

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8collationiterator.cpp
# Opt level: O0

int32_t __thiscall icu_63::FCDUTF8CollationIterator::getOffset(FCDUTF8CollationIterator *this)

{
  FCDUTF8CollationIterator *this_local;
  
  if (this->state == IN_NORMALIZED) {
    if ((this->super_UTF8CollationIterator).pos == 0) {
      this_local._4_4_ = this->start;
    }
    else {
      this_local._4_4_ = this->limit;
    }
  }
  else {
    this_local._4_4_ = (this->super_UTF8CollationIterator).pos;
  }
  return this_local._4_4_;
}

Assistant:

int32_t
FCDUTF8CollationIterator::getOffset() const {
    if(state != IN_NORMALIZED) {
        return pos;
    } else if(pos == 0) {
        return start;
    } else {
        return limit;
    }
}